

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_unitsEqualPrecision4_Test::Equality_unitsEqualPrecision4_Test
          (Equality_unitsEqualPrecision4_Test *this)

{
  Equality_unitsEqualPrecision4_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Equality_unitsEqualPrecision4_Test_00149c70;
  return;
}

Assistant:

TEST(Equality, unitsEqualPrecision4)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second", 238487722399.29384);
    u2->addUnit("second", 238487722399.29383);

    EXPECT_TRUE(u1->equals(u2));
    EXPECT_TRUE(u2->equals(u1));
}